

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O0

uint Kit_TruthSemiCanonicize_new(uint *pInOut,uint *pAux,int nVars,char *pCanonPerm)

{
  word local_38;
  word Temp;
  char *pcStack_28;
  uint Result;
  char *pCanonPerm_local;
  uint *puStack_18;
  int nVars_local;
  uint *pAux_local;
  uint *pInOut_local;
  
  pcStack_28 = pCanonPerm;
  pCanonPerm_local._4_4_ = nVars;
  puStack_18 = pAux;
  pAux_local = pInOut;
  if (nVars < 6) {
    local_38 = CONCAT44(*pInOut,*pInOut);
    Temp._4_4_ = Kit_TruthSemiCanonicize_new_internal(&local_38,nVars,pCanonPerm);
    *pAux_local = (uint)local_38;
  }
  else {
    Temp._4_4_ = Kit_TruthSemiCanonicize_new_internal((word *)pInOut,nVars,pCanonPerm);
  }
  return Temp._4_4_;
}

Assistant:

unsigned Kit_TruthSemiCanonicize_new( unsigned * pInOut, unsigned * pAux, int nVars, char * pCanonPerm )
{
    unsigned Result;
    if ( nVars < 6 )
    {
         word Temp = ((word)pInOut[0] << 32) | (word)pInOut[0];
         Result = Kit_TruthSemiCanonicize_new_internal( &Temp, nVars, pCanonPerm );
         pInOut[0] = (unsigned)Temp;
    }
    else
         Result = Kit_TruthSemiCanonicize_new_internal( (word *)pInOut, nVars, pCanonPerm );
    return Result;
}